

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O0

int rtosc_arg_val_null(rtosc_arg_val_t *av,char type)

{
  char type_local;
  rtosc_arg_val_t *av_local;
  int local_4;
  
  av->type = type;
  switch(type) {
  case 'F':
  case 'T':
    av->type = 'F';
    (av->val).T = '\0';
    local_4 = 1;
    break;
  default:
    local_4 = 0;
    break;
  case 'S':
  case 's':
    (av->val).d = 0.0;
    local_4 = 1;
    break;
  case 'c':
  case 'i':
  case 'r':
    (av->val).i = 0;
    local_4 = 1;
    break;
  case 'd':
    (av->val).d = 0.0;
    local_4 = 1;
    break;
  case 'f':
    (av->val).i = 0;
    local_4 = 1;
    break;
  case 'h':
    (av->val).d = 0.0;
    local_4 = 1;
    break;
  case 't':
    (av->val).d = 0.0;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int rtosc_arg_val_null(rtosc_arg_val_t* av, char type)
{
    av->type = type;
    switch(type)
    {
        case 'h': av->val.h = 0; return true;
        case 't': av->val.t = 0; return true;
        case 's':
        case 'S': av->val.s = NULL; return true;
        case 'd': av->val.d = 0.0; return true;
        case 'f': av->val.f = 0.0f; return true;
        case 'c':
        case 'i':
        case 'r': av->val.i = 0; return true;
        case 'T':
        case 'F': av->type = 'F'; av->val.T = 0; return true;
        default: return false;
    }
}